

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O2

Watcher_CAPI * remove_callback(efsw_watcher watcher)

{
  const_iterator __position;
  
  __position._M_current =
       g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  while (__position._M_current !=
         g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if ((*__position._M_current)->mWatcher == watcher) {
      __position._M_current =
           (Watcher_CAPI **)
           std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::erase
                     (&g_callbacks,__position);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return (Watcher_CAPI *)0x0;
}

Assistant:

Watcher_CAPI* remove_callback( efsw_watcher watcher ) {
	std::vector<Watcher_CAPI*>::iterator i = g_callbacks.begin();

	while ( i != g_callbacks.end() ) {
		Watcher_CAPI* callback = *i;

		if ( callback->mWatcher == watcher )
			i = g_callbacks.erase( i );
		else
			++i;
	}

	return NULL;
}